

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O3

void __thiscall
srell::regex_internal::
re_search_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::init_for_automaton
          (re_search_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,re_state *entry,uint num_of_submatches,uint num_of_counters,uint num_of_repeats)

{
  char *pcVar1;
  pointer prVar2;
  long lVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var4;
  ulong newsize;
  ulong __new_size;
  
  this->entry_state_ = entry;
  __new_size = (ulong)num_of_submatches;
  std::
  vector<srell::regex_internal::re_submatch_type<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<srell::regex_internal::re_submatch_type<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize(&this->bracket,__new_size);
  newsize = (ulong)num_of_counters;
  if ((this->counter).capacity_ < newsize) {
    simple_array<unsigned_int>::reserve(&this->counter,newsize);
  }
  (this->counter).size_ = newsize;
  std::
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::resize(&this->repeat,(ulong)num_of_repeats);
  p_Var4 = &this->srchend;
  if ((this->flags_ & match_continuous) != format_default) {
    p_Var4 = &this->srchbegin;
  }
  (this->nth).in_string._M_current = p_Var4->_M_current;
  if (1 < num_of_submatches) {
    lVar3 = __new_size * 0x18 + -8;
    do {
      __new_size = __new_size - 1;
      pcVar1 = (this->srchend)._M_current;
      prVar2 = (this->bracket).
               super__Vector_base<srell::regex_internal::re_submatch_type<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<srell::regex_internal::re_submatch_type<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(char **)((long)prVar2 + lVar3 + -8) = pcVar1;
      *(char **)((long)prVar2 + lVar3 + -0x10) = pcVar1;
      *(undefined4 *)((long)&(prVar2->core).open_at._M_current + lVar3) = 0;
      lVar3 = lVar3 + -0x18;
    } while (1 < __new_size);
  }
  clear_stacks(this);
  return;
}

Assistant:

void init_for_automaton
	(
		const re_state/*<charT>*/ *const entry,
		unsigned int num_of_submatches,
		const unsigned int num_of_counters,
		const unsigned int num_of_repeats
	)
	{
		entry_state_ = entry;

		bracket.resize(num_of_submatches);
		counter.resize(num_of_counters);
		repeat.resize(num_of_repeats);

		nth.in_string = (flags_ & regex_constants::match_continuous) ? srchbegin : srchend;

		while (num_of_submatches > 1)
		{
			submatch_type &br = bracket[--num_of_submatches];

			br.core.open_at = br.core.close_at = this->srchend;
			br.counter = 0;
			//  15.10.2.9; AtomEscape:
			//  If the regular expression has n or more capturing parentheses
			//  but the nth one is undefined because it hasn't captured anything,
			//  then the backreference always succeeds.

			//  C.f., table 27 and 28 on TR1, table 142 and 143 on C++11.
		}

		clear_stacks();
	}